

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O2

int __thiscall calibrate_button(VCONTROLLER *this,int i)

{
  long lVar1;
  
  if (((byte)key_array[0x3b] & 1) == 0) {
    for (lVar1 = 1; lVar1 != 0xe3; lVar1 = lVar1 + 1) {
      if ((*(byte *)(key_array + lVar1) & 2) != 0) {
        *(int *)((long)this->private_data + (long)i * 4) = (int)lVar1;
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int calibrate_button(VCONTROLLER * this, int i)
{
   int c;

   if (key_down(ALLEGRO_KEY_ESCAPE)) {
      return 0;
   }

   for (c = 1; c < ALLEGRO_KEY_MAX; c++) {
      if (key_pressed(c)) {
         ((int *)(this->private_data))[i] = c;
         return 1;
      }
   }

   return 0;
}